

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O3

void __thiscall
cfd::api::json::ElementsDecodeRawTransactionResponse::ConvertFromStruct
          (ElementsDecodeRawTransactionResponse *this,
          ElementsDecodeRawTransactionResponseStruct *data)

{
  int64_t iVar1;
  
  std::__cxx11::string::_M_assign((string *)&this->txid_);
  std::__cxx11::string::_M_assign((string *)&this->hash_);
  std::__cxx11::string::_M_assign((string *)&this->wtxid_);
  std::__cxx11::string::_M_assign((string *)&this->withash_);
  this->version_ = data->version;
  iVar1 = data->vsize;
  this->size_ = data->size;
  this->vsize_ = iVar1;
  this->weight_ = data->weight;
  this->locktime_ = data->locktime;
  core::
  JsonObjectVector<cfd::api::json::ElementsDecodeRawTransactionTxIn,_ElementsDecodeRawTransactionTxInStruct>
  ::ConvertFromStruct(&this->vin_,&data->vin);
  core::
  JsonObjectVector<cfd::api::json::ElementsDecodeRawTransactionTxOut,_ElementsDecodeRawTransactionTxOutStruct>
  ::ConvertFromStruct(&this->vout_,&data->vout);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->ignore_items)._M_t,&(data->ignore_items)._M_t);
  return;
}

Assistant:

void ElementsDecodeRawTransactionResponse::ConvertFromStruct(
    const ElementsDecodeRawTransactionResponseStruct& data) {
  txid_ = data.txid;
  hash_ = data.hash;
  wtxid_ = data.wtxid;
  withash_ = data.withash;
  version_ = data.version;
  size_ = data.size;
  vsize_ = data.vsize;
  weight_ = data.weight;
  locktime_ = data.locktime;
  vin_.ConvertFromStruct(data.vin);
  vout_.ConvertFromStruct(data.vout);
  ignore_items = data.ignore_items;
}